

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::SingleFieldGenerator::WantsHasProperty
          (SingleFieldGenerator *this)

{
  bool bVar1;
  OneofDescriptor *pOVar2;
  FileDescriptor *file;
  SingleFieldGenerator *this_local;
  
  pOVar2 = FieldDescriptor::containing_oneof((this->super_FieldGenerator).descriptor_);
  if (pOVar2 == (OneofDescriptor *)0x0) {
    file = FieldDescriptor::file((this->super_FieldGenerator).descriptor_);
    bVar1 = HasFieldPresence(file);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SingleFieldGenerator::WantsHasProperty(void) const {
  if (descriptor_->containing_oneof() != NULL) {
    // If in a oneof, it uses the oneofcase instead of a has bit.
    return false;
  }
  if (HasFieldPresence(descriptor_->file())) {
    // In proto1/proto2, every field has a has_$name$() method.
    return true;
  }
  return false;
}